

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataLisp.cpp
# Opt level: O3

string_t * __thiscall DL::DataLisp::dump_abi_cxx11_(string_t *__return_storage_ptr__,DataLisp *this)

{
  SyntaxTree *pSVar1;
  pointer ppSVar2;
  int in_ECX;
  pointer ppSVar3;
  string_t local_50;
  
  pSVar1 = this->mInternal->mTree;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (pSVar1 == (SyntaxTree *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    ppSVar3 = (pSVar1->Nodes).
              super__Vector_base<DL::StatementNode_*,_std::allocator<DL::StatementNode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppSVar2 = (pSVar1->Nodes).
              super__Vector_base<DL::StatementNode_*,_std::allocator<DL::StatementNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppSVar3 != ppSVar2) {
      do {
        DataLisp_Internal::dumpNode_abi_cxx11_
                  (&local_50,(DataLisp_Internal *)*ppSVar3,(StatementNode *)0x1,in_ECX);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        ppSVar3 = ppSVar3 + 1;
      } while (ppSVar3 != ppSVar2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string_t DataLisp::dump()
{
	if (!mInternal->mTree) {
		return "";
	} else {
		string_t str;
		for (StatementNode* ptr : mInternal->mTree->Nodes)
			str += DataLisp_Internal::dumpNode(ptr, 1);

		return str;
	}
}